

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

TestSuite * __thiscall
testing::internal::UnitTestImpl::GetTestSuite
          (UnitTestImpl *this,char *test_suite_name,char *type_param,SetUpTestSuiteFunc set_up_tc,
          TearDownTestSuiteFunc tear_down_tc)

{
  vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_> *this_00;
  pointer *pppTVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  iterator __position;
  iterator __position_00;
  bool bVar3;
  int iVar4;
  TestSuite *pTVar5;
  TestSuite *new_test_suite;
  reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
  test_suite;
  UnitTestFilter death_test_suite_filter;
  allocator<char> local_e1;
  string local_e0;
  TestSuite *local_c0;
  undefined1 local_b8 [16];
  undefined1 local_a8 [24];
  long local_90 [2];
  undefined1 local_80 [24];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_68;
  
  local_b8._8_8_ =
       (this->test_suites_).
       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_b8._0_8_ =
       (this->test_suites_).
       super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
       super__Vector_impl_data._M_start;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,test_suite_name,(allocator<char> *)&local_e0);
  local_a8._8_8_ = local_90;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_a8 + 8),local_80._0_8_,
             (undefined1 *)
             ((long)&((_Alloc_hider *)local_80._8_8_)->_M_p +
             (long)&((_Alloc_hider *)local_80._0_8_)->_M_p));
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite**,std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>>>,testing::internal::TestSuiteNameIs>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)local_a8,
             (reverse_iterator<__gnu_cxx::__normal_iterator<testing::TestSuite_**,_std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>_>_>
              *)(local_b8 + 8),(TestSuiteNameIs *)local_b8);
  if ((long *)local_a8._8_8_ != local_90) {
    operator_delete((void *)local_a8._8_8_,local_90[0] + 1);
  }
  this_00 = &this->test_suites_;
  if ((pointer)local_80._0_8_ != (pointer)(local_80 + 0x10)) {
    operator_delete((void *)local_80._0_8_,
                    (ulong)((long)&((_Alloc_hider *)local_80._16_8_)->_M_p + 1));
  }
  if ((pointer)local_a8._0_8_ ==
      (this_00->super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>).
      _M_impl.super__Vector_impl_data._M_start) {
    pTVar5 = (TestSuite *)operator_new(0x108);
    TestSuite::TestSuite(pTVar5,test_suite_name,type_param,set_up_tc,tear_down_tc);
    paVar2 = &local_e0.field_2;
    local_e0._M_dataplus._M_p = (pointer)paVar2;
    local_c0 = pTVar5;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"*DeathTest:*DeathTest/*","");
    anon_unknown_37::UnitTestFilter::UnitTestFilter((UnitTestFilter *)local_80,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_e0,test_suite_name,&local_e1);
    bVar3 = anon_unknown_37::UnitTestFilter::MatchesName((UnitTestFilter *)local_80,&local_e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != paVar2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if (bVar3) {
      iVar4 = this->last_death_test_suite_;
      this->last_death_test_suite_ = iVar4 + 1;
      std::vector<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>::insert
                (this_00,(const_iterator)
                         ((this->test_suites_).
                          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>
                          ._M_impl.super__Vector_impl_data._M_start + (long)iVar4 + 1),&local_c0);
    }
    else {
      __position._M_current =
           (this->test_suites_).
           super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->test_suites_).
          super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<testing::TestSuite*,std::allocator<testing::TestSuite*>>::
        _M_realloc_insert<testing::TestSuite*const&>
                  ((vector<testing::TestSuite*,std::allocator<testing::TestSuite*>> *)this_00,
                   __position,&local_c0);
      }
      else {
        *__position._M_current = pTVar5;
        pppTVar1 = &(this->test_suites_).
                    super__Vector_base<testing::TestSuite_*,_std::allocator<testing::TestSuite_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
    }
    __position_00._M_current =
         (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    iVar4 = (int)((ulong)((long)__position_00._M_current -
                         (long)(this->test_suite_indices_).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2);
    local_e0._M_dataplus._M_p._0_4_ = iVar4;
    if (__position_00._M_current ==
        (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                (&this->test_suite_indices_,__position_00,(int *)&local_e0);
    }
    else {
      *__position_00._M_current = iVar4;
      (this->test_suite_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
    pTVar5 = local_c0;
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable(&local_68);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_80);
  }
  else {
    pTVar5 = *(pointer)(local_a8._0_8_ - 8);
  }
  return pTVar5;
}

Assistant:

TestSuite* UnitTestImpl::GetTestSuite(
    const char* test_suite_name, const char* type_param,
    internal::SetUpTestSuiteFunc set_up_tc,
    internal::TearDownTestSuiteFunc tear_down_tc) {
  // Can we find a TestSuite with the given name?
  const auto test_suite =
      std::find_if(test_suites_.rbegin(), test_suites_.rend(),
                   TestSuiteNameIs(test_suite_name));

  if (test_suite != test_suites_.rend()) return *test_suite;

  // No.  Let's create one.
  auto* const new_test_suite =
      new TestSuite(test_suite_name, type_param, set_up_tc, tear_down_tc);

  const UnitTestFilter death_test_suite_filter(kDeathTestSuiteFilter);
  // Is this a death test suite?
  if (death_test_suite_filter.MatchesName(test_suite_name)) {
    // Yes.  Inserts the test suite after the last death test suite
    // defined so far.  This only works when the test suites haven't
    // been shuffled.  Otherwise we may end up running a death test
    // after a non-death test.
    ++last_death_test_suite_;
    test_suites_.insert(test_suites_.begin() + last_death_test_suite_,
                        new_test_suite);
  } else {
    // No.  Appends to the end of the list.
    test_suites_.push_back(new_test_suite);
  }

  test_suite_indices_.push_back(static_cast<int>(test_suite_indices_.size()));
  return new_test_suite;
}